

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O1

void generate<trng::mrg4>(size_t samples,unsigned_long seed)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  parameter_type P;
  mrg4 r;
  char local_51;
  mrg4 local_50;
  
  P.a[2] = 0x44ddb3f9;
  P.a[3] = 0x6370d8d2;
  P.a[0] = 0x7753d502;
  P.a[1] = 0x542dbf61;
  trng::mrg4::mrg4(&local_50,P);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# generator ",0xc);
  __s = trng::mrg4::name();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3510d0);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  seed = ",9);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"#==================================================================\n",0x44);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"type: d\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"count: ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"numbit: ",8);
  iVar1 = trng::int_math::log2_ceil<int>(0x7ffffffe);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_51,1);
  if (samples != 0) {
    do {
      uVar4 = (long)local_50.S.r[3] * (long)local_50.P.a[3] +
              (long)local_50.P.a[2] * (long)local_50.S.r[2] +
              (long)local_50.P.a[1] * (long)local_50.S.r[1] +
              (long)local_50.P.a[0] * (long)local_50.S.r[0];
      local_50.S.r[3] = local_50.S.r[2];
      local_50.S.r[2] = local_50.S.r[1];
      local_50.S.r[1] = local_50.S.r[0];
      uVar5 = (uVar4 >> 0x1f) + (uVar4 & 0x7fffffff);
      uVar4 = uVar5 - 0x1fffffffc;
      if ((uint)(uVar5 >> 2) < 0x7fffffff) {
        uVar4 = uVar5;
      }
      uVar5 = uVar4 - 0xfffffffe;
      if (uVar4 < 0xfffffffe) {
        uVar5 = uVar4;
      }
      local_50.S.r[0] = (int)uVar5 + -0x7fffffff;
      if (uVar5 < 0x7fffffff) {
        local_50.S.r[0] = (int)uVar5;
      }
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_50.S.r[0]);
      local_51 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_51,1);
      samples = samples - 1;
    } while (samples != 0);
  }
  return;
}

Assistant:

void generate(std::size_t samples, unsigned long seed) {
  R r;
  std::cout << "#==================================================================\n"
            << "# generator " << r.name() << "  seed = " << seed << "\n"
            << "#==================================================================\n"
            << "type: d\n"
            << "count: " << samples << "\n"
            << "numbit: " << trng::int_math::log2_ceil(r.max() - r.min()) << '\n';
  for (std::size_t j{0}; j < samples; ++j)
    std::cout << r() - r.min() << '\n';
}